

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall
ComplexType::createObjectForType(ComplexType *this,ASN_TYPE valueType)

{
  IntegerType *this_00;
  OctetType *this_01;
  OIDType *this_02;
  NullType *this_03;
  ImplicitNullType *pIVar1;
  NetworkAddress *this_04;
  TimestampType *this_05;
  Counter32 *this_06;
  Gauge *this_07;
  Counter64 *this_08;
  OpaqueType *this_09;
  ComplexType *this_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<BER_CONTAINER> sVar3;
  ASN_TYPE valueType_local;
  
  if (valueType - INTEGER < 0xa5 || valueType == Trapv2PDU) {
    switch((long)&switchD_00108366::switchdataD_001270e0 +
           (long)(int)(&switchD_00108366::switchdataD_001270e0)[valueType - INTEGER]) {
    case 0x108368:
      this_00 = (IntegerType *)operator_new(0x18);
      IntegerType::IntegerType(this_00);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_00);
      _Var2._M_pi = extraout_RDX;
      break;
    case 0x1083af:
      this_01 = (OctetType *)operator_new(0x30);
      OctetType::OctetType(this_01);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<OctetType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_01);
      _Var2._M_pi = extraout_RDX_00;
      break;
    case 0x1083f6:
      this_02 = (OIDType *)operator_new(0x50);
      OIDType::OIDType(this_02);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_02);
      _Var2._M_pi = extraout_RDX_01;
      break;
    case 0x10843d:
      this_03 = (NullType *)operator_new(0x10);
      NullType::NullType(this_03);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<NullType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_03);
      _Var2._M_pi = extraout_RDX_02;
      break;
    case 0x108484:
      pIVar1 = (ImplicitNullType *)operator_new(0x10);
      ImplicitNullType::ImplicitNullType(pIVar1,NOSUCHOBJECT);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ImplicitNullType,void>
                ((shared_ptr<BER_CONTAINER> *)this,pIVar1);
      _Var2._M_pi = extraout_RDX_03;
      break;
    case 0x1084d0:
      pIVar1 = (ImplicitNullType *)operator_new(0x10);
      ImplicitNullType::ImplicitNullType(pIVar1,NOSUCHINSTANCE);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ImplicitNullType,void>
                ((shared_ptr<BER_CONTAINER> *)this,pIVar1);
      _Var2._M_pi = extraout_RDX_04;
      break;
    case 0x10851c:
      pIVar1 = (ImplicitNullType *)operator_new(0x10);
      ImplicitNullType::ImplicitNullType(pIVar1,ENDOFMIBVIEW);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ImplicitNullType,void>
                ((shared_ptr<BER_CONTAINER> *)this,pIVar1);
      _Var2._M_pi = extraout_RDX_05;
      break;
    case 0x108568:
      this_04 = (NetworkAddress *)operator_new(0x20);
      NetworkAddress::NetworkAddress(this_04);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<NetworkAddress,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_04);
      _Var2._M_pi = extraout_RDX_06;
      break;
    case 0x1085af:
      this_05 = (TimestampType *)operator_new(0x18);
      TimestampType::TimestampType(this_05);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<TimestampType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_05);
      _Var2._M_pi = extraout_RDX_07;
      break;
    case 0x1085f6:
      this_06 = (Counter32 *)operator_new(0x18);
      Counter32::Counter32(this_06);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<Counter32,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_06);
      _Var2._M_pi = extraout_RDX_08;
      break;
    case 0x108646:
      this_07 = (Gauge *)operator_new(0x18);
      Gauge::Gauge(this_07);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<Gauge,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_07);
      _Var2._M_pi = extraout_RDX_09;
      break;
    case 0x108696:
      this_08 = (Counter64 *)operator_new(0x18);
      Counter64::Counter64(this_08);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<Counter64,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_08);
      _Var2._M_pi = extraout_RDX_10;
      break;
    case 0x1086e6:
      this_09 = (OpaqueType *)operator_new(0x20);
      OpaqueType::OpaqueType(this_09);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<OpaqueType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_09);
      _Var2._M_pi = extraout_RDX_11;
      break;
    case 0x108730:
      this_10 = (ComplexType *)operator_new(0x28);
      ComplexType(this_10,valueType);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
                ((shared_ptr<BER_CONTAINER> *)this,this_10);
      _Var2._M_pi = extraout_RDX_12;
      break;
    default:
      goto switchD_00108366_caseD_10877d;
    }
  }
  else {
switchD_00108366_caseD_10877d:
    std::shared_ptr<BER_CONTAINER>::shared_ptr((shared_ptr<BER_CONTAINER> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX_13;
  }
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BER_CONTAINER;
  return (shared_ptr<BER_CONTAINER>)
         sVar3.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> ComplexType::createObjectForType(ASN_TYPE valueType){
    SNMP_LOGD("Creating object of type: %d\n", valueType);
    switch(valueType){
        case INTEGER:
            return std::shared_ptr<BER_CONTAINER>(new IntegerType());
        case STRING:
            return std::shared_ptr<BER_CONTAINER>(new OctetType());
        case OID: 
            return std::shared_ptr<BER_CONTAINER>(new OIDType());
        case NULLTYPE:
            return std::shared_ptr<BER_CONTAINER>(new NullType());

        case NOSUCHOBJECT:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(NOSUCHOBJECT));
        case NOSUCHINSTANCE:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(NOSUCHINSTANCE));
        case ENDOFMIBVIEW:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(ENDOFMIBVIEW));

        // devired
        case NETWORK_ADDRESS:
            return std::shared_ptr<BER_CONTAINER>(new NetworkAddress());
        case TIMESTAMP:
            return std::shared_ptr<BER_CONTAINER>(new TimestampType());
        case COUNTER32:
            return std::shared_ptr<BER_CONTAINER>(new Counter32());
        case GAUGE32:
            return std::shared_ptr<BER_CONTAINER>(new Gauge());
        case COUNTER64:
            return std::shared_ptr<BER_CONTAINER>(new Counter64());
        case OPAQUE:
            return std::shared_ptr<BER_CONTAINER>(new OpaqueType());

        // Complex
        /* OPAQUE = 0x44 */
        case STRUCTURE:

        case GetRequestPDU:
        case GetNextRequestPDU:
        case GetResponsePDU:
        case SetRequestPDU:
        case GetBulkRequestPDU:

        //case TrapPDU: // should never get v1trap, but put it in anyway
        case InformRequestPDU:
        case Trapv2PDU:
            return std::shared_ptr<BER_CONTAINER>(new ComplexType(valueType));
        default:
            return nullptr;
    }
}